

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,int dim,float coeff,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  Allocator *pAVar10;
  void *pvVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int *piVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  void *pvVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  
  uVar5 = a->w;
  lVar12 = (long)(int)uVar5;
  uVar8 = (ulong)uVar5;
  uVar6 = a->h;
  uVar16 = a->c;
  lVar20 = (long)(int)uVar16;
  sVar1 = a->elemsize;
  if (dim == 0) {
    pAVar10 = opt->blob_allocator;
    if ((((b->dims != 1) || (b->w != 1)) || (b->elemsize != sVar1)) || (b->allocator != pAVar10)) {
      piVar17 = b->refcount;
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (b->allocator == (Allocator *)0x0) {
            if (b->data != (void *)0x0) {
              free(*(void **)((long)b->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)b->allocator + 8))();
          }
        }
      }
      b->data = (void *)0x0;
      b->refcount = (int *)0x0;
      b->elemsize = 0;
      b->cstep = 0;
      b->dims = 0;
      b->w = 0;
      b->h = 0;
      b->c = 0;
      b->elemsize = sVar1;
      b->allocator = pAVar10;
      b->dims = 1;
      b->w = 1;
      b->h = 1;
      b->c = 1;
      b->cstep = 1;
      uVar19 = sVar1 + 3 & 0xfffffffffffffffc;
      if (pAVar10 == (Allocator *)0x0) {
        pvVar11 = malloc(uVar19 + 0x1c);
        pvVar7 = (void *)((long)pvVar11 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar7 - 8) = pvVar11;
      }
      else {
        pvVar7 = (void *)(*(code *)**(undefined8 **)pAVar10)(pAVar10);
      }
      b->data = pvVar7;
      b->refcount = (int *)((long)pvVar7 + uVar19);
      *(undefined4 *)((long)pvVar7 + uVar19) = 1;
    }
    goto switchD_00119caf_caseD_0;
  }
  switch(dim) {
  default:
    goto switchD_00119caf_caseD_0;
  case 1:
    pAVar10 = opt->blob_allocator;
    uVar23 = uVar16;
LAB_00119d40:
    Mat::create(b,uVar23,sVar1,pAVar10);
    goto switchD_00119caf_caseD_0;
  case 2:
    pAVar10 = opt->blob_allocator;
    uVar23 = uVar16;
    uVar37 = uVar6;
    break;
  case -2:
    pAVar10 = opt->blob_allocator;
    uVar23 = uVar6;
    uVar37 = uVar5;
    break;
  case -1:
    pAVar10 = opt->blob_allocator;
    uVar23 = uVar5;
    goto LAB_00119d40;
  }
  Mat::create(b,uVar37,uVar23,sVar1,pAVar10);
switchD_00119caf_caseD_0:
  if (b->data == (void *)0x0) {
    return -100;
  }
  if ((long)b->c * b->cstep == 0) {
    return -100;
  }
  uVar23 = uVar6 * uVar5;
  if (dim == 0) {
    pAVar10 = opt->workspace_allocator;
    if (uVar16 == 0) {
      uVar8 = 0;
      piVar17 = (int *)0x0;
    }
    else {
      uVar19 = sVar1 * lVar20 + 3 & 0xfffffffffffffffc;
      if (pAVar10 == (Allocator *)0x0) {
        pvVar11 = malloc(uVar19 + 0x1c);
        uVar8 = (long)pvVar11 + 0x17U & 0xfffffffffffffff0;
        *(void **)(uVar8 - 8) = pvVar11;
      }
      else {
        uVar8 = (*(code *)**(undefined8 **)pAVar10)(pAVar10,uVar19 + 4);
      }
      piVar17 = (int *)(uVar8 + uVar19);
      *(undefined4 *)(uVar8 + uVar19) = 1;
    }
    if (uVar16 == 0 || uVar8 == 0) {
      if (piVar17 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 != 0) {
        return -100;
      }
      if (pAVar10 != (Allocator *)0x0) {
        (**(code **)(*(long *)pAVar10 + 8))(pAVar10,uVar8);
        return -100;
      }
      if (uVar8 == 0) {
        return -100;
      }
      pvVar11 = *(void **)(uVar8 - 8);
LAB_0011a470:
      free(pvVar11);
      return -100;
    }
    if (0 < (int)uVar16) {
      pvVar11 = a->data;
      sVar1 = a->cstep;
      sVar4 = a->elemsize;
      lVar12 = 0;
      do {
        fVar27 = 0.0;
        if (0 < (int)uVar23) {
          uVar19 = 0;
          do {
            fVar27 = fVar27 + *(float *)((long)pvVar11 + uVar19 * 4);
            uVar19 = uVar19 + 1;
          } while (uVar23 != uVar19);
        }
        *(float *)(uVar8 + lVar12 * 4) = fVar27;
        lVar12 = lVar12 + 1;
        pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar4);
      } while (lVar12 != lVar20);
    }
    auVar28 = ZEXT816(0);
    if (0 < (int)uVar16) {
      lVar12 = 0;
      do {
        auVar28._0_4_ = auVar28._0_4_ + *(float *)(uVar8 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar20 != lVar12);
    }
    *(float *)b->data = auVar28._0_4_ * v0;
    if (piVar17 != (int *)0x0) {
      LOCK();
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        if (pAVar10 == (Allocator *)0x0) {
          if (uVar8 != 0) {
            free(*(void **)(uVar8 - 8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar10 + 8))(pAVar10,uVar8);
        }
      }
    }
    if (uVar16 == 0 || uVar8 == 0) {
      return -100;
    }
  }
  else {
    switch(dim) {
    case 1:
      if (0 < (int)uVar16) {
        sVar1 = a->cstep;
        sVar4 = a->elemsize;
        pvVar11 = a->data;
        pvVar7 = b->data;
        lVar12 = 0;
        do {
          fVar27 = 0.0;
          if (0 < (int)uVar23) {
            uVar8 = 0;
            do {
              fVar27 = fVar27 + *(float *)((long)pvVar11 + uVar8 * 4);
              uVar8 = uVar8 + 1;
            } while (uVar23 != uVar8);
          }
          *(float *)((long)pvVar7 + lVar12 * 4) = fVar27 * v0;
          lVar12 = lVar12 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar4);
        } while (lVar12 != lVar20);
      }
      break;
    case 2:
      if (0 < (int)uVar16) {
        pvVar11 = a->data;
        sVar1 = a->cstep;
        sVar4 = a->elemsize;
        pvVar7 = b->data;
        sVar2 = b->cstep;
        sVar3 = b->elemsize;
        uVar16 = uVar5 - 1;
        lVar18 = 0;
        do {
          if (0 < (int)uVar6) {
            pvVar21 = (void *)(sVar1 * sVar4 * lVar18 + (long)pvVar11);
            uVar8 = 0;
            do {
              if ((int)uVar5 < 1) {
                fVar27 = 0.0;
              }
              else {
                fVar27 = *(float *)((long)pvVar21 + uVar8 * 4);
                fVar30 = 0.0;
                fVar32 = 0.0;
                fVar34 = 0.0;
                fVar36 = 0.0;
                iVar13 = 4;
                do {
                  fVar35 = fVar36;
                  fVar33 = fVar34;
                  fVar31 = fVar32;
                  fVar29 = fVar30;
                  fVar30 = fVar27 + fVar29;
                  fVar32 = fVar27 + fVar31;
                  fVar34 = fVar27 + fVar33;
                  fVar36 = fVar27 + fVar35;
                  iVar14 = iVar13 + -4;
                  iVar24 = iVar13 + (uVar5 + 3 & 0xfffffffc);
                  iVar13 = iVar14;
                } while (iVar24 != 8);
                uVar23 = -iVar14;
                uVar37 = -(uint)((int)(uVar16 ^ 0x80000000) < (int)(uVar23 ^ 0x80000000));
                uVar38 = -(uint)((int)(uVar16 ^ 0x80000000) < (int)((uVar23 | 1) ^ 0x80000000));
                uVar39 = -(uint)((int)(uVar16 ^ 0x80000000) < (int)((uVar23 | 2) ^ 0x80000000));
                uVar23 = -(uint)((int)(uVar16 ^ 0x80000000) < (int)((uVar23 | 3) ^ 0x80000000));
                fVar27 = (float)(~uVar23 & (uint)fVar36 | (uint)fVar35 & uVar23) +
                         (float)(~uVar38 & (uint)fVar32 | (uint)fVar31 & uVar38) +
                         (float)(~uVar39 & (uint)fVar34 | (uint)fVar33 & uVar39) +
                         (float)(~uVar37 & (uint)fVar30 | (uint)fVar29 & uVar37);
              }
              *(float *)((long)pvVar7 + uVar8 * 4 + sVar2 * sVar3 * lVar18) = fVar27 * v0;
              pvVar21 = (void *)((long)pvVar21 + lVar12 * 4);
              uVar8 = uVar8 + 1;
            } while (uVar8 != uVar6);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != lVar20);
      }
      break;
    case -2:
      uVar5 = b->c * (int)b->cstep;
      if (0 < (int)uVar5) {
        memset(b->data,0,(ulong)uVar5 << 2);
      }
      if (0 < (int)uVar16) {
        sVar1 = a->cstep;
        sVar4 = a->elemsize;
        pvVar11 = a->data;
        pvVar7 = b->data;
        lVar12 = 0;
        do {
          if (0 < (int)uVar23) {
            uVar8 = 0;
            do {
              *(float *)((long)pvVar7 + uVar8 * 4) =
                   *(float *)((long)pvVar11 + uVar8 * 4) + *(float *)((long)pvVar7 + uVar8 * 4);
              uVar8 = uVar8 + 1;
            } while (uVar23 != uVar8);
          }
          lVar12 = lVar12 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar4);
        } while (lVar12 != lVar20);
      }
      if (0 < (int)uVar23) {
        pvVar11 = b->data;
        uVar8 = 0;
        do {
          *(float *)((long)pvVar11 + uVar8 * 4) = *(float *)((long)pvVar11 + uVar8 * 4) * v0;
          uVar8 = uVar8 + 1;
        } while (uVar23 != uVar8);
      }
      break;
    case -1:
      pAVar10 = opt->workspace_allocator;
      uVar19 = sVar1 * lVar12 + 0xf & 0xfffffffffffffff0;
      pvVar11 = (void *)0x0;
      uVar9 = uVar19 / sVar1;
      piVar17 = (int *)0x0;
      if (uVar9 * lVar20 != 0) {
        uVar25 = uVar9 * lVar20 * sVar1 + 3 & 0xfffffffffffffffc;
        if (pAVar10 == (Allocator *)0x0) {
          pvVar7 = malloc(uVar25 + 0x1c);
          pvVar11 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar11 - 8) = pvVar7;
        }
        else {
          pvVar11 = (void *)(*(code *)**(undefined8 **)pAVar10)(pAVar10,uVar25 + 4,uVar19 % sVar1);
        }
        piVar17 = (int *)((long)pvVar11 + uVar25);
        *(undefined4 *)((long)pvVar11 + uVar25) = 1;
      }
      bVar26 = (long)(int)uVar16 * uVar9 == 0;
      if (bVar26 || pvVar11 == (void *)0x0) {
        if (piVar17 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 != 0) {
          return -100;
        }
        if (pAVar10 != (Allocator *)0x0) {
          (**(code **)(*(long *)pAVar10 + 8))();
          return -100;
        }
        if (pvVar11 == (void *)0x0) {
          return -100;
        }
        pvVar11 = *(void **)((long)pvVar11 + -8);
        goto LAB_0011a470;
      }
      uVar23 = (int)uVar9 * uVar16;
      if (0 < (int)uVar23) {
        memset(pvVar11,0,(ulong)uVar23 << 2);
      }
      if (0 < (int)uVar16) {
        sVar4 = a->cstep;
        sVar2 = a->elemsize;
        pvVar7 = a->data;
        lVar18 = 0;
        do {
          if (0 < (int)uVar6) {
            lVar15 = uVar9 * sVar1 * lVar18;
            pvVar21 = (void *)(sVar4 * sVar2 * lVar18 + (long)pvVar7);
            uVar19 = 0;
            do {
              if (0 < (int)uVar5) {
                lVar22 = 0;
                uVar25 = uVar8;
                do {
                  *(float *)((long)pvVar11 + lVar22 * 4 + lVar15) =
                       *(float *)((long)pvVar21 + uVar19 * 4) +
                       *(float *)((long)pvVar11 + lVar22 * 4 + lVar15);
                  lVar22 = lVar22 + 1;
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
              }
              pvVar21 = (void *)((long)pvVar21 + lVar12 * 4);
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar6);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != lVar20);
      }
      uVar6 = b->c * (int)b->cstep;
      if (0 < (int)uVar6) {
        memset(b->data,0,(ulong)uVar6 << 2);
      }
      if (0 < (int)uVar16) {
        pvVar7 = b->data;
        lVar12 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar19 = 0;
            do {
              *(float *)((long)pvVar7 + uVar19 * 4) =
                   *(float *)((long)pvVar11 + uVar19 * 4 + uVar9 * sVar1 * lVar12) +
                   *(float *)((long)pvVar7 + uVar19 * 4);
              uVar19 = uVar19 + 1;
            } while (uVar8 != uVar19);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar20);
      }
      if (0 < (int)uVar5) {
        pvVar7 = b->data;
        uVar19 = 0;
        do {
          *(float *)((long)pvVar7 + uVar19 * 4) = *(float *)((long)pvVar7 + uVar19 * 4) * v0;
          uVar19 = uVar19 + 1;
        } while (uVar8 != uVar19);
      }
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (pAVar10 == (Allocator *)0x0) {
            if (pvVar11 != (void *)0x0) {
              free(*(void **)((long)pvVar11 + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar10 + 8))(pAVar10,pvVar11);
          }
        }
      }
      if (bVar26 || pvVar11 == (void *)0x0) {
        return -100;
      }
    }
  }
  return 0;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, int dim, float coeff, const Option& opt)
{
    Op op;
    Op2 op2;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    size_t elemsize = a.elemsize;
    int size = w * h;

    if (dim == 0)
    {
        // w h c -> X X X
        b.create(1, elemsize, opt.blob_allocator);
    }
    else if (dim == 1)
    {
        // w h c -> X X c
        b.create(channels, elemsize, opt.blob_allocator);
    }
    else if (dim == 2)
    {
        // w h c -> X h c
        b.create(h, channels, elemsize, opt.blob_allocator);
    }
    else if (dim == -1)
    {
        // w h c -> w X X
        b.create(w, elemsize, opt.blob_allocator);
    }
    else if (dim == -2)
    {
        // w h c -> w h X
        b.create(w, h, elemsize, opt.blob_allocator);
    }
    if (b.empty())
        return -100;

    if (dim == 0)
    {
        Mat sums(channels, elemsize, opt.workspace_allocator);
        if (sums.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            sums[q] = sum;
        }

        float sum = v0;
        for (int i=0; i<channels; i++)
        {
            sum = op2(sum, sums[i]);
        }

        b[0] = sum * coeff;
    }
    else if (dim == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            b[q] = sum * coeff;
        }
    }
    else if (dim == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = b.channel(q);

            for (int i=0; i<h; i++)
            {
                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[i] = sum * coeff;

                ptr += w;
            }
        }
    }
    else if (dim == -1)
    {
        Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
        if (mins.empty())
            return -100;

        mins.fill(v0);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* mins_ptr = mins.channel(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    mins_ptr[j] = op(mins_ptr[j], ptr[i]);
                }

                ptr += w;
            }
        }

        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* mins_ptr = mins.channel(q);
            for (int j=0; j<w; j++)
            {
                b[j] = op2(b[j], mins_ptr[j]);
            }
        }

        for (int j=0; j<w; j++)
        {
            b[j] *= coeff;
        }
    }
    else if (dim == -2)
    {
        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            for (int i=0; i<size; i++)
            {
                b[i] = op(b[i], ptr[i]);
            }
        }

        for (int i=0; i<size; i++)
        {
            b[i] *= coeff;
        }
    }

    return 0;
}